

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O2

CURLcode tftp_set_timeouts(tftp_state_data *state)

{
  int iVar1;
  int iVar2;
  timediff_t tVar3;
  ulong uVar4;
  CURLcode CVar5;
  
  tVar3 = Curl_timeleft(state->data,(curltime *)0x0,state->state == TFTP_STATE_START);
  if (tVar3 < 0) {
    Curl_failf(state->data,"Connection time-out");
    CVar5 = CURLE_OPERATION_TIMEDOUT;
  }
  else {
    if (tVar3 == 0) {
      uVar4 = 0xe10;
    }
    else {
      uVar4 = (tVar3 + 500U) / 1000;
    }
    iVar2 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / 5);
    iVar1 = 0x32;
    if (iVar2 < 0x32) {
      iVar1 = iVar2;
    }
    iVar2 = 3;
    if (0xe < (int)uVar4) {
      iVar2 = iVar1;
    }
    state->retry_max = iVar2;
    iVar2 = (int)((long)uVar4 / (long)iVar2);
    iVar1 = 1;
    if (1 < iVar2) {
      iVar1 = iVar2;
    }
    state->retry_time = iVar1;
    CVar5 = CURLE_OK;
    Curl_infof(state->data,"set timeouts for state %d; Total % ld, retry %d maxtry %d",
               (ulong)state->state);
    time(&state->rx_time);
  }
  return CVar5;
}

Assistant:

static CURLcode tftp_set_timeouts(struct tftp_state_data *state)
{
  time_t maxtime, timeout;
  timediff_t timeout_ms;
  bool start = (state->state == TFTP_STATE_START) ? TRUE : FALSE;

  /* Compute drop-dead time */
  timeout_ms = Curl_timeleft(state->data, NULL, start);

  if(timeout_ms < 0) {
    /* time-out, bail out, go home */
    failf(state->data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(timeout_ms > 0)
    maxtime = (time_t)(timeout_ms + 500) / 1000;
  else
    maxtime = 3600; /* use for calculating block timeouts */

  /* Set per-block timeout to total */
  timeout = maxtime;

  /* Average reposting an ACK after 5 seconds */
  state->retry_max = (int)timeout/5;

  /* But bound the total number */
  if(state->retry_max<3)
    state->retry_max = 3;

  if(state->retry_max>50)
    state->retry_max = 50;

  /* Compute the re-ACK interval to suit the timeout */
  state->retry_time = (int)(timeout/state->retry_max);
  if(state->retry_time<1)
    state->retry_time = 1;

  infof(state->data,
        "set timeouts for state %d; Total % " CURL_FORMAT_CURL_OFF_T
        ", retry %d maxtry %d",
        (int)state->state, timeout_ms, state->retry_time, state->retry_max);

  /* init RX time */
  time(&state->rx_time);

  return CURLE_OK;
}